

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void jinit_color_converter(j_compress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_color_converter *pjVar3;
  code *pcVar4;
  
  pjVar3 = (jpeg_color_converter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x18);
  cinfo->cconvert = pjVar3;
  pjVar3->start_pass = null_method;
  switch(cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1) {
LAB_00117c1d:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->input_components != 3) goto LAB_00117c1d;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4) goto LAB_00117c1d;
    break;
  default:
    if (cinfo->input_components < 1) goto LAB_00117c1d;
  }
  switch(cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    JVar1 = cinfo->in_color_space;
    if (JVar1 != JCS_YCbCr) {
      if (JVar1 == JCS_RGB) {
        pjVar3->start_pass = rgb_ycc_start;
        pcVar4 = rgb_gray_convert;
        goto LAB_00117db3;
      }
      if (JVar1 != JCS_GRAYSCALE) goto LAB_00117d67;
    }
    pcVar4 = grayscale_convert;
    goto LAB_00117db3;
  case JCS_RGB:
    if (cinfo->num_components != 3) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_RGB) {
LAB_00117d67:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x1c;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      return;
    }
    pcVar4 = rgb_convert;
    goto LAB_00117db3;
  case JCS_YCbCr:
    if (cinfo->num_components != 3) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_YCbCr) {
      if (cinfo->in_color_space != JCS_RGB) goto LAB_00117d67;
      pjVar3->start_pass = rgb_ycc_start;
      pcVar4 = rgb_ycc_convert;
      goto LAB_00117db3;
    }
    break;
  case JCS_CMYK:
    if (cinfo->num_components != 4) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_CMYK) goto LAB_00117d67;
    break;
  case JCS_YCCK:
    if (cinfo->num_components != 4) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space != JCS_YCCK) {
      if (cinfo->in_color_space != JCS_CMYK) goto LAB_00117d67;
      pjVar3->start_pass = rgb_ycc_start;
      pcVar4 = cmyk_ycck_convert;
      goto LAB_00117db3;
    }
    break;
  default:
    if ((cinfo->jpeg_color_space != cinfo->in_color_space) ||
       (cinfo->num_components != cinfo->input_components)) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x1c;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  pcVar4 = null_convert;
LAB_00117db3:
  pjVar3->color_convert = pcVar4;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_converter (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_converter));
  cinfo->cconvert = (struct jpeg_color_converter *) cconvert;
  /* set start_pass to null method until we find out differently */
  cconvert->pub.start_pass = null_method;

  /* Make sure input_components agrees with in_color_space */
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_RGB:
    if (cinfo->input_components != RGB_PIXELSIZE)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_YCbCr:
    if (cinfo->input_components != 3)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->input_components < 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;
  }

  /* Check num_components, set conversion method based on requested space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_GRAYSCALE ||
	cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = grayscale_convert;
    else if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_gray_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB)
      cconvert->pub.color_convert = rgb_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_ycc_convert;
    } else if (cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = cmyk_ycck_convert;
    } else if (cinfo->in_color_space == JCS_YCCK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:			/* allow null conversion of JCS_UNKNOWN */
    if (cinfo->jpeg_color_space != cinfo->in_color_space ||
	cinfo->num_components != cinfo->input_components)
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    cconvert->pub.color_convert = null_convert;
    break;
  }
}